

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_23e9e7::ValueSetter::writeAppearance(ValueSetter *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  double dVar1;
  pointer pbVar2;
  _Alloc_hider _Var3;
  int iVar4;
  __type_conflict1 _Var5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  reference pvVar10;
  unsigned_long __n;
  unsigned_long uVar11;
  pointer __n_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  string *this_01;
  size_type __n_01;
  size_t i;
  ulong __n_02;
  pointer pcVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double num;
  undefined1 auVar16 [16];
  size_t nopt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  unsigned_long local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  int wanted_first;
  int wanted_last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  double local_128;
  double dStack_120;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->replaced = true;
  num = this->tf * 1.2;
  dVar14 = ((this->bbox).ury - (this->bbox).lly) / num;
  uVar9 = (ulong)dVar14;
  uVar9 = (long)(dVar14 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n_00 = (this->opt).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->opt).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar13 = __n_00 != pbVar2;
  if (1 < uVar9 && bVar13) {
    this_00 = &this->opt;
    nopt = (long)pbVar2 - (long)__n_00 >> 5;
    for (local_1e0._M_dataplus._M_p = (pointer)0x0; local_1e0._M_dataplus._M_p < nopt;
        local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1) {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at(this_00,(size_type)local_1e0._M_dataplus._M_p);
      _Var5 = std::operator==(pvVar10,&this->V);
      if (_Var5) {
        iVar6 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                          ((unsigned_long *)&local_1e0);
        wanted_first = iVar6 + -1;
        local_148._M_dataplus._M_p = local_1e0._M_dataplus._M_p + uVar9;
        iVar6 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                          ((unsigned_long *)&local_148);
        iVar6 = iVar6 + -2;
        if (wanted_first < 0) {
          iVar6 = iVar6 - wanted_first;
          wanted_first = 0;
        }
        wanted_last = iVar6;
        iVar7 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&nopt);
        iVar4 = wanted_last;
        if (iVar7 <= iVar6) {
          iVar6 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&nopt);
          iVar6 = (iVar4 - iVar6) + 1;
          uVar8 = wanted_first - iVar6;
          __n_00 = (pointer)0x0;
          if (0 < (int)uVar8) {
            __n_00 = (pointer)(ulong)uVar8;
          }
          wanted_first = (int)__n_00;
          wanted_last = wanted_last - iVar6;
        }
        _Var3._M_p = local_1e0._M_dataplus._M_p;
        local_1c0 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&wanted_first);
        __n = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&wanted_first);
        while( true ) {
          uVar11 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&wanted_last);
          if (uVar11 < __n) break;
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at(this_00,__n);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&lines,pvVar10);
          __n = __n + 1;
        }
        pcVar12 = _Var3._M_p + (1 - local_1c0);
        auVar15._8_4_ = (int)((ulong)pcVar12 >> 0x20);
        auVar15._0_8_ = pcVar12;
        auVar15._12_4_ = 0x45300000;
        dStack_120 = auVar15._8_8_ - 1.9342813113834067e+25;
        local_128 = dStack_120 + ((double)CONCAT44(0x43300000,(int)pcVar12) - 4503599627370496.0);
        goto LAB_0015b65b;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&lines,&this->V);
    local_128 = 1.0;
    dStack_120 = 0.0;
    for (__n_02 = 0; (__n_02 < nopt && (__n_02 < uVar9 - 1)); __n_02 = __n_02 + 1) {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at(this_00,__n_02);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&lines,pvVar10);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&lines,&this->V);
    local_128 = 1.0;
    dStack_120 = 0.0;
  }
LAB_0015b65b:
  dVar14 = (this->bbox).ury;
  local_1c0 = (long)lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  auVar16._8_4_ =
       (int)((long)lines.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)lines.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 0x25);
  auVar16._0_8_ = local_1c0;
  auVar16._12_4_ = 0x45300000;
  dVar14 = ((dVar14 - (this->bbox).lly) -
           ((auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_1c0) - 4503599627370496.0)) * num) * -0.5 +
           dVar14;
  if (1 < uVar9 && bVar13) {
    QUtil::double_to_string_abi_cxx11_(&local_b0,(QUtil *)0x0,(this->bbox).llx,1,SUB81(__n_00,0));
    std::operator+(&local_90,"q\n0.85 0.85 0.85 rg\n",&local_b0);
    std::operator+(&local_70,&local_90," ");
    QUtil::double_to_string_abi_cxx11_
              (&local_d0,(QUtil *)0x0,((this->bbox).lly + dVar14) - local_128 * num,1,
               SUB81(__n_00,0));
    std::operator+(&local_50,&local_70,&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wanted_last
                   ,&local_50," ");
    QUtil::double_to_string_abi_cxx11_
              (&local_f0,(QUtil *)0x0,(this->bbox).urx - (this->bbox).llx,1,SUB81(__n_00,0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &wanted_first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wanted_last
                   ,&local_f0);
    std::operator+(&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &wanted_first," ");
    QUtil::double_to_string_abi_cxx11_(&local_110,(QUtil *)0x0,num,1,SUB81(__n_00,0));
    std::operator+(&local_1e0,&local_148,&local_110);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nopt,
                   &local_1e0," re f\nQ\n");
    QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&nopt,__buf,(size_t)__n_00);
    std::__cxx11::string::~string((string *)&nopt);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&wanted_first);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&wanted_last);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  dVar1 = this->tf;
  std::operator+(&local_1e0,"q\nBT\n",&this->DA);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nopt,
                 &local_1e0,"\n");
  QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&nopt,__buf_00,(size_t)__n_00);
  std::__cxx11::string::~string((string *)&nopt);
  std::__cxx11::string::~string((string *)&local_1e0);
  for (__n_01 = 0; local_1c0 != __n_01; __n_01 = __n_01 + 1) {
    iVar6 = (int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nopt;
    if (__n_01 == 0) {
      QUtil::double_to_string_abi_cxx11_
                ((string *)&wanted_first,(QUtil *)0x0,(this->bbox).llx + 1.0,1,SUB81(__n_00,0));
      std::operator+(&local_148,(string *)&wanted_first," ");
      QUtil::double_to_string_abi_cxx11_
                ((string *)&wanted_last,(QUtil *)0x0,(this->bbox).lly + (dVar14 - dVar1),1,
                 SUB81(__n_00,0));
      std::operator+(&local_1e0,&local_148,(string *)&wanted_last);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nopt,
                     &local_1e0," Td\n");
      QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,iVar6,__buf_02,(size_t)__n_00);
      std::__cxx11::string::~string((string *)&nopt);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&wanted_last);
      std::__cxx11::string::~string((string *)&local_148);
      this_01 = (string *)&wanted_first;
    }
    else {
      QUtil::double_to_string_abi_cxx11_(&local_148,(QUtil *)0x0,-num,1,SUB81(__n_00,0));
      std::operator+(&local_1e0,"0 ",&local_148);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nopt,
                     &local_1e0," Td\n");
      QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,iVar6,__buf_01,(size_t)__n_00);
      std::__cxx11::string::~string((string *)&nopt);
      std::__cxx11::string::~string((string *)&local_1e0);
      this_01 = &local_148;
    }
    std::__cxx11::string::~string((string *)this_01);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at(&lines,__n_01);
    QPDFObjectHandle::newString(&local_148);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_1e0,(QPDFObjectHandle *)&local_148);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nopt,
                   &local_1e0," Tj\n");
    QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,iVar6,__buf_03,(size_t)__n_00);
    std::__cxx11::string::~string((string *)&nopt);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_148._M_string_length);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nopt,"ET\nQ\nEMC",(allocator<char> *)&local_1e0);
  QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&nopt,__buf_04,(size_t)__n_00);
  std::__cxx11::string::~string((string *)&nopt);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  return;
}

Assistant:

void
ValueSetter::writeAppearance()
{
    this->replaced = true;

    // This code does not take quadding into consideration because doing so requires font metric
    // information, which we don't have in many cases.

    double tfh = 1.2 * tf;
    int dx = 1;

    // Write one or more lines, centered vertically, possibly with one row highlighted.

    auto max_rows = static_cast<size_t>((bbox.ury - bbox.lly) / tfh);
    bool highlight = false;
    size_t highlight_idx = 0;

    std::vector<std::string> lines;
    if (opt.empty() || (max_rows < 2)) {
        lines.push_back(V);
    } else {
        // Figure out what rows to write
        size_t nopt = opt.size();
        size_t found_idx = 0;
        bool found = false;
        for (found_idx = 0; found_idx < nopt; ++found_idx) {
            if (opt.at(found_idx) == V) {
                found = true;
                break;
            }
        }
        if (found) {
            // Try to make the found item the second one, but adjust for under/overflow.
            int wanted_first = QIntC::to_int(found_idx) - 1;
            int wanted_last = QIntC::to_int(found_idx + max_rows) - 2;
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper list found");
            if (wanted_first < 0) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper list first too low");
                wanted_last -= wanted_first;
                wanted_first = 0;
            }
            if (wanted_last >= QIntC::to_int(nopt)) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper list last too high");
                auto diff = wanted_last - QIntC::to_int(nopt) + 1;
                wanted_first = std::max(0, wanted_first - diff);
                wanted_last -= diff;
            }
            highlight = true;
            highlight_idx = found_idx - QIntC::to_size(wanted_first);
            for (size_t i = QIntC::to_size(wanted_first); i <= QIntC::to_size(wanted_last); ++i) {
                lines.push_back(opt.at(i));
            }
        } else {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper list not found");
            // include our value and the first n-1 rows
            highlight_idx = 0;
            highlight = true;
            lines.push_back(V);
            for (size_t i = 0; ((i < nopt) && (i < (max_rows - 1))); ++i) {
                lines.push_back(opt.at(i));
            }
        }
    }

    // Write the lines centered vertically, highlighting if needed
    size_t nlines = lines.size();
    double dy = bbox.ury - ((bbox.ury - bbox.lly - (static_cast<double>(nlines) * tfh)) / 2.0);
    if (highlight) {
        write(
            "q\n0.85 0.85 0.85 rg\n" + QUtil::double_to_string(bbox.llx) + " " +
            QUtil::double_to_string(
                bbox.lly + dy - (tfh * (static_cast<double>(highlight_idx + 1)))) +
            " " + QUtil::double_to_string(bbox.urx - bbox.llx) + " " +
            QUtil::double_to_string(tfh) + " re f\nQ\n");
    }
    dy -= tf;
    write("q\nBT\n" + DA + "\n");
    for (size_t i = 0; i < nlines; ++i) {
        // We could adjust Tm to translate to the beginning the first line, set TL to tfh, and use
        // T* for each subsequent line, but doing this would require extracting any Tm from DA,
        // which doesn't seem really worth the effort.
        if (i == 0) {
            write(
                QUtil::double_to_string(bbox.llx + static_cast<double>(dx)) + " " +
                QUtil::double_to_string(bbox.lly + static_cast<double>(dy)) + " Td\n");
        } else {
            write("0 " + QUtil::double_to_string(-tfh) + " Td\n");
        }
        write(QPDFObjectHandle::newString(lines.at(i)).unparse() + " Tj\n");
    }
    write("ET\nQ\nEMC");
}